

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCompiler.cpp
# Opt level: O0

void __thiscall Refal2::CLeftPartCompiler::matchVE(CLeftPartCompiler *this,bool isRightDirection)

{
  TVariableIndex TVar1;
  bool bVar2;
  CNodeType *pCVar3;
  TVariableIndex *pTVar4;
  CVariable *pCVar5;
  TVariableIndex variableIndex_1;
  TVariableIndex variableIndex;
  bool isRightDirection_local;
  CLeftPartCompiler *this_local;
  
  checkBorders(this);
  if (isRightDirection) {
    pCVar3 = CNodeList<Refal2::CUnit>::GetLast((CNodeList<Refal2::CUnit> *)this->hole);
    pTVar4 = CUnit::Variable(&pCVar3->super_CUnit);
    TVar1 = *pTVar4;
    pCVar5 = CVariables::GetVariable(&(this->super_CFunctionCompilerBase).variables,TVar1);
    bVar2 = CVariable::TypeIs(pCVar5,VT_E);
    if (bVar2) {
      matchVariable(this,TVar1,0x158db0);
    }
    else {
      matchVariable(this,TVar1,0x158eb0);
    }
    CNodeList<Refal2::CUnit>::RemoveLast((CNodeList<Refal2::CUnit> *)this->hole);
  }
  else {
    pCVar3 = CNodeList<Refal2::CUnit>::GetFirst((CNodeList<Refal2::CUnit> *)this->hole);
    pTVar4 = CUnit::Variable(&pCVar3->super_CUnit);
    TVar1 = *pTVar4;
    pCVar5 = CVariables::GetVariable(&(this->super_CFunctionCompilerBase).variables,TVar1);
    bVar2 = CVariable::TypeIs(pCVar5,VT_E);
    if (bVar2) {
      matchVariable(this,TVar1,0x158b60);
    }
    else {
      matchVariable(this,TVar1,0x158c90);
    }
    CNodeList<Refal2::CUnit>::RemoveFirst((CNodeList<Refal2::CUnit> *)this->hole);
  }
  return;
}

Assistant:

void CLeftPartCompiler::matchVE(const bool isRightDirection)
{
	checkBorders();
	if( isRightDirection ) {
		TVariableIndex variableIndex = hole->GetLast()->Variable();

		if( variables.GetVariable( variableIndex ).TypeIs( VT_E ) ) {
			matchVariable( variableIndex,
				&COperationsBuilder::AddMatchRight_E );
		} else {
			matchVariable( variableIndex,
				&COperationsBuilder::AddMatchRight_V );
		}

		hole->RemoveLast();
	} else {
		TVariableIndex variableIndex = hole->GetFirst()->Variable();

		if( variables.GetVariable( variableIndex ).TypeIs( VT_E ) ) {
			matchVariable( variableIndex,
				&COperationsBuilder::AddMatchLeft_E );
		} else {
			matchVariable( variableIndex,
				&COperationsBuilder::AddMatchLeft_V );
		}

		hole->RemoveFirst();
	}
}